

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FastSet.h
# Opt level: O1

CFastSet<unsigned_int> * __thiscall
CFastSet<unsigned_int>::operator=(CFastSet<unsigned_int> *this,CSet *set)

{
  size_t sVar1;
  long lVar2;
  _Rb_tree_color *p_Var3;
  _Rb_tree_node_base *p_Var4;
  ulong uVar5;
  
  if (this->elements != (uint *)0x0) {
    operator_delete__(this->elements);
  }
  sVar1 = (set->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  this->elementsSize = (int)sVar1;
  lVar2 = sVar1 << 0x20;
  uVar5 = 0xffffffffffffffff;
  if (-1 < lVar2) {
    uVar5 = lVar2 >> 0x1e;
  }
  p_Var3 = (_Rb_tree_color *)operator_new__(uVar5);
  this->elements = p_Var3;
  p_Var4 = (set->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  while ((_Rb_tree_header *)p_Var4 != &(set->_M_t)._M_impl.super__Rb_tree_header) {
    *p_Var3 = p_Var4[1]._M_color;
    p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
    p_Var3 = p_Var3 + 1;
  }
  return this;
}

Assistant:

CFastSet<T>& CFastSet<T>::operator=(const CSet& set)
{
	delete[] elements;
	elementsSize = set.size();
	elements = new T[elementsSize];
	
	int i = 0;
	for( typename CSet::const_iterator j = set.begin(); j != set.end(); ++j ) {
		elements[i] = *j;
		i++;
	}

	return *this;
}